

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O2

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::transient_to_rrb<int,false,6>
          (immutable *this,ref<immutable::transient_rrb<int,_false,_6>_> *trrb)

{
  transient_rrb<int,_false,_6> *ptVar1;
  rrb<int,_false,_6> *prVar2;
  ref<immutable::rrb_details::leaf_node<int,_false>_> leaf;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_18;
  
  ptVar1 = ref<immutable::transient_rrb<int,_false,_6>_>::operator->(trrb);
  ptVar1->guid = 0;
  ptVar1 = ref<immutable::transient_rrb<int,_false,_6>_>::operator->(trrb);
  local_18.ptr = rrb_details::leaf_node_clone<int,false>((ptVar1->tail).ptr);
  if (local_18.ptr != (leaf_node<int,_false> *)0x0) {
    (local_18.ptr)->_ref_count = 1;
  }
  ptVar1 = ref<immutable::transient_rrb<int,_false,_6>_>::operator->(trrb);
  ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&ptVar1->tail,&local_18);
  prVar2 = rrb_details::rrb_head_clone<int,false,6>((rrb<int,_false,_6> *)trrb->ptr);
  *(rrb<int,_false,_6> **)this = prVar2;
  if (prVar2 != (rrb<int,_false,_6> *)0x0) {
    prVar2->_ref_count = 1;
  }
  rrb_details::release<int>(local_18.ptr);
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> transient_to_rrb(const ref<transient_rrb<T, atomic_ref_counting, N>>& trrb)
    {
    using namespace rrb_details;
    trrb->guid = 0;
    ref<leaf_node<T, atomic_ref_counting>> leaf = leaf_node_clone<T, atomic_ref_counting>(trrb->tail.ptr);
    trrb->tail = leaf;
    ref<rrb<T, atomic_ref_counting, N>> out = rrb_head_clone((const rrb<T, atomic_ref_counting, N>*)trrb.ptr);
    return out;
    }